

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

void __thiscall StructTable::print(StructTable *this)

{
  Symbol *pSVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  Symbol **ppSVar4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"\n*****************************");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\t\t");
  poVar2 = std::operator<<(poVar2,"STRUCTS");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"*****************************");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Lexeme");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Scope");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Scope Lexeme");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Size");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"*****************************");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar3 = 0; lVar3 != 0x65; lVar3 = lVar3 + 1) {
    ppSVar4 = (this->super_SymbolTable).block + lVar3;
    while (pSVar1 = *ppSVar4, pSVar1 != (Symbol *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               (this->super_SymbolTable).lexemeArray + pSVar1->lexemeIndex);
      poVar2 = std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pSVar1->scope);
      poVar2 = std::operator<<(poVar2,"\t");
      poVar2 = std::operator<<(poVar2,pSVar1->lexemeScope);
      poVar2 = std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pSVar1[1].lexemeIndex);
      std::endl<char,std::char_traits<char>>(poVar2);
      ppSVar4 = &pSVar1->nextSymbol;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"*****************************");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "##########################################################");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void StructTable::print() {
    cout << "\n*****************************" << endl;
    cout << "\t\t" << "STRUCTS" << endl;
    cout << "*****************************" << endl;
    cout << "Lexeme" << "\t" << "Scope" << "\t" << "Scope Lexeme" << "\t" << "Size" << endl;
    cout << "*****************************" << endl;

    for (int i = 0; i < TABLE_SIZE; i++) {
        for (StructSymbol *symbol = (StructSymbol *) block[i];
             symbol != NULL; symbol = (StructSymbol *) symbol->getNextSymbol()) {
            cout << lexemeArray + symbol->getLexemeIndex() << "\t" << symbol->getScope() << "\t"
                 << symbol->getLexemeScope() << "\t" << symbol->getSize() << endl;
        }
    }
    cout << "*****************************" << endl;
    cout << "##########################################################" << endl;
}